

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O3

REF_STATUS ref_subdiv_test_pri(REF_DBL (*xyz) [3],REF_BOOL *possible)

{
  int in_EAX;
  int iVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  
  *possible = 1;
  dVar17 = (*xyz)[0];
  dVar22 = (*xyz)[1];
  dVar7 = xyz[1][1] - dVar22;
  dVar18 = (*xyz)[2];
  dVar21 = xyz[2][2] - dVar18;
  dVar12 = xyz[1][2] - dVar18;
  dVar9 = xyz[2][1] - dVar22;
  dVar23 = xyz[1][0] - dVar17;
  dVar14 = xyz[2][0] - dVar17;
  dVar24 = xyz[3][0];
  dVar13 = xyz[4][0];
  dVar8 = xyz[5][0];
  auVar10._0_8_ = xyz[2][0] + dVar17 + xyz[1][0];
  auVar10._8_8_ = dVar8 + dVar13 + dVar24;
  auVar10 = divpd(auVar10,_DAT_00214b00);
  dVar17 = xyz[3][1];
  dVar16 = xyz[4][1];
  dVar20 = xyz[3][2];
  dVar15 = xyz[4][2];
  dVar19 = xyz[5][2];
  auVar3._0_8_ = xyz[2][2] + xyz[1][2] + dVar18;
  auVar3._8_8_ = dVar19 + dVar15 + dVar20;
  dVar18 = xyz[5][1];
  auVar5._0_8_ = xyz[2][1] + dVar22 + xyz[1][1];
  auVar5._8_8_ = dVar18 + dVar16 + dVar17;
  auVar5 = divpd(auVar5,_DAT_00214b00);
  auVar3 = divpd(auVar3,_DAT_00214b00);
  dVar22 = (auVar3._8_8_ - auVar3._0_8_) * (dVar23 * dVar9 - dVar14 * dVar7) * 0.5 +
           (auVar5._8_8_ - auVar5._0_8_) * (dVar21 * dVar23 - dVar12 * dVar14) * -0.5 +
           (auVar10._8_8_ - auVar10._0_8_) * (dVar7 * dVar21 - dVar9 * dVar12) * 0.5;
  if (dVar22 < 0.0) {
    in_EAX = puts("bad pri base");
    *possible = 0;
    dVar18 = xyz[5][1];
    dVar17 = xyz[3][1];
    dVar15 = xyz[4][2];
    dVar20 = xyz[3][2];
    dVar19 = xyz[5][2];
    dVar16 = xyz[4][1];
    dVar8 = xyz[5][0];
    dVar24 = xyz[3][0];
    dVar13 = xyz[4][0];
    auVar11._0_8_ = xyz[2][0] + xyz[1][0] + (*xyz)[0];
    auVar11._8_8_ = dVar8 + dVar13 + dVar24;
    auVar10 = divpd(auVar11,_DAT_00214b00);
    auVar6._0_8_ = xyz[2][1] + xyz[1][1] + (*xyz)[1];
    auVar6._8_8_ = dVar18 + dVar16 + dVar17;
    auVar4._0_8_ = xyz[2][2] + xyz[1][2] + (*xyz)[2];
    auVar4._8_8_ = dVar19 + dVar20 + dVar15;
    auVar5 = divpd(auVar6,_DAT_00214b00);
    auVar3 = divpd(auVar4,_DAT_00214b00);
  }
  if (0.0 <= (auVar3._0_8_ - auVar3._8_8_) *
             ((dVar8 - dVar24) * (dVar16 - dVar17) - (dVar13 - dVar24) * (dVar18 - dVar17)) * 0.5 +
             (auVar5._0_8_ - auVar5._8_8_) *
             ((dVar15 - dVar20) * (dVar8 - dVar24) - (dVar19 - dVar20) * (dVar13 - dVar24)) * -0.5 +
             (auVar10._0_8_ - auVar10._8_8_) *
             ((dVar18 - dVar17) * (dVar15 - dVar20) - (dVar16 - dVar17) * (dVar19 - dVar20)) * 0.5)
  {
    if (0.0 <= dVar22) {
      return in_EAX;
    }
  }
  else {
    puts("bad pri top");
    *possible = 0;
  }
  printf("zone t=\"bad\", nodes=6, elements=1, datapacking=point, zonetype=febrick");
  lVar2 = 0x10;
  do {
    printf(" %.16e %.16e %.16e\n",*(undefined8 *)((long)xyz[-1] + lVar2 + 8),
           *(undefined8 *)((long)xyz[-1] + lVar2 + 0x10),*(undefined8 *)((long)*xyz + lVar2));
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0xa0);
  iVar1 = puts(" 1 2 3 3 4 5 6 6");
  return iVar1;
}

Assistant:

REF_FCN static REF_STATUS ref_subdiv_test_pri(REF_DBL xyz[6][3],
                                              REF_BOOL *possible) {
  REF_INT n1, n2, n3;
  REF_DBL xnorm, ynorm, znorm;
  REF_DBL dx, dy, dz;
  REF_DBL crdot;

  REF_INT i;

  *possible = REF_TRUE;

  n1 = 0;
  n2 = 1;
  n3 = 2;

  xnorm = 0.5 * ((xyz[n2][1] - xyz[n1][1]) * (xyz[n3][2] - xyz[n1][2]) -
                 (xyz[n2][2] - xyz[n1][2]) * (xyz[n3][1] - xyz[n1][1]));
  ynorm = -0.5 * ((xyz[n2][0] - xyz[n1][0]) * (xyz[n3][2] - xyz[n1][2]) -
                  (xyz[n2][2] - xyz[n1][2]) * (xyz[n3][0] - xyz[n1][0]));
  znorm = 0.5 * ((xyz[n2][0] - xyz[n1][0]) * (xyz[n3][1] - xyz[n1][1]) -
                 (xyz[n2][1] - xyz[n1][1]) * (xyz[n3][0] - xyz[n1][0]));

  dx = (xyz[3][0] + xyz[4][0] + xyz[5][0]) / 3.0 -
       (xyz[0][0] + xyz[1][0] + xyz[2][0]) / 3.0;
  dy = (xyz[3][1] + xyz[4][1] + xyz[5][1]) / 3.0 -
       (xyz[0][1] + xyz[1][1] + xyz[2][1]) / 3.0;
  dz = (xyz[3][2] + xyz[4][2] + xyz[5][2]) / 3.0 -
       (xyz[0][2] + xyz[1][2] + xyz[2][2]) / 3.0;

  crdot = dx * xnorm + dy * ynorm + dz * znorm;

  if (crdot < 0.0) {
    printf("bad pri base\n");
    *possible = REF_FALSE;
  }

  n1 = 3;
  n2 = 5;
  n3 = 4;

  xnorm = 0.5 * ((xyz[n2][1] - xyz[n1][1]) * (xyz[n3][2] - xyz[n1][2]) -
                 (xyz[n2][2] - xyz[n1][2]) * (xyz[n3][1] - xyz[n1][1]));
  ynorm = -0.5 * ((xyz[n2][0] - xyz[n1][0]) * (xyz[n3][2] - xyz[n1][2]) -
                  (xyz[n2][2] - xyz[n1][2]) * (xyz[n3][0] - xyz[n1][0]));
  znorm = 0.5 * ((xyz[n2][0] - xyz[n1][0]) * (xyz[n3][1] - xyz[n1][1]) -
                 (xyz[n2][1] - xyz[n1][1]) * (xyz[n3][0] - xyz[n1][0]));

  dx = -(xyz[3][0] + xyz[4][0] + xyz[5][0]) / 3.0 +
       (xyz[0][0] + xyz[1][0] + xyz[2][0]) / 3.0;
  dy = -(xyz[3][1] + xyz[4][1] + xyz[5][1]) / 3.0 +
       (xyz[0][1] + xyz[1][1] + xyz[2][1]) / 3.0;
  dz = -(xyz[3][2] + xyz[4][2] + xyz[5][2]) / 3.0 +
       (xyz[0][2] + xyz[1][2] + xyz[2][2]) / 3.0;

  crdot = dx * xnorm + dy * ynorm + dz * znorm;

  if (crdot < 0.0) {
    printf("bad pri top\n");
    *possible = REF_FALSE;
  }

  if (!*possible) {
    printf(
        "zone t=\"bad\", nodes=6, elements=1, datapacking=point, "
        "zonetype=febrick");
    for (i = 0; i < 6; i++)
      printf(" %.16e %.16e %.16e\n", xyz[i][0], xyz[i][1], xyz[i][2]);
    printf(" 1 2 3 3 4 5 6 6\n");
  }

  return REF_SUCCESS;
}